

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatMem.c
# Opt level: O0

void Msat_MmStepStop(Msat_MmStep_t *p,int fVerbose)

{
  int local_18;
  int i;
  int fVerbose_local;
  Msat_MmStep_t *p_local;
  
  for (local_18 = 0; local_18 < p->nMems; local_18 = local_18 + 1) {
    Msat_MmFixedStop(p->pMems[local_18],fVerbose);
  }
  if (p->pMems != (Msat_MmFixed_t **)0x0) {
    free(p->pMems);
    p->pMems = (Msat_MmFixed_t **)0x0;
  }
  if (p->pMap != (Msat_MmFixed_t **)0x0) {
    free(p->pMap);
    p->pMap = (Msat_MmFixed_t **)0x0;
  }
  if (p != (Msat_MmStep_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Msat_MmStepStop( Msat_MmStep_t * p, int fVerbose )
{
    int i;
    for ( i = 0; i < p->nMems; i++ )
        Msat_MmFixedStop( p->pMems[i], fVerbose );
    ABC_FREE( p->pMems );
    ABC_FREE( p->pMap );
    ABC_FREE( p );
}